

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_trans_affine.cpp
# Opt level: O0

void __thiscall agg::trans_affine::scaling(trans_affine *this,double *x,double *y)

{
  double dVar1;
  trans_affine local_a0;
  undefined1 local_70 [8];
  trans_affine t;
  double y2;
  double x2;
  double y1;
  double x1;
  double *y_local;
  double *x_local;
  trans_affine *this_local;
  
  y1 = 0.0;
  x2 = 0.0;
  y2 = 1.0;
  t.ty = 1.0;
  x1 = (double)y;
  y_local = x;
  x_local = &this->sx;
  memcpy(local_70,this,0x30);
  dVar1 = rotation(this);
  trans_affine_rotation::trans_affine_rotation((trans_affine_rotation *)&local_a0,-dVar1);
  operator*=((trans_affine *)local_70,&local_a0);
  transform((trans_affine *)local_70,&y1,&x2);
  transform((trans_affine *)local_70,&y2,&t.ty);
  *y_local = y2 - y1;
  *(double *)x1 = t.ty - x2;
  return;
}

Assistant:

void trans_affine::scaling(double* x, double* y) const
    {
        double x1 = 0.0;
        double y1 = 0.0;
        double x2 = 1.0;
        double y2 = 1.0;
        trans_affine t(*this);
        t *= trans_affine_rotation(-rotation());
        t.transform(&x1, &y1);
        t.transform(&x2, &y2);
        *x = x2 - x1;
        *y = y2 - y1;
    }